

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modjpeg.c
# Opt level: O0

void help(void)

{
  fprintf(_stderr,"modjpeg (c) 2006+ Ingo Oppermann\n\n");
  fprintf(_stderr,
          "The order for the options is important, i.e. a dropon can\'t be applied without\n");
  fprintf(_stderr,"loading an image first.\n\n");
  fprintf(_stderr,"Options:\n\n");
  fprintf(_stderr,"\t--input, -i file\n");
  fprintf(_stderr,"\t\tPath to the image to be modified. The image needs to be a JPEG.\n");
  fprintf(_stderr,"\n");
  fprintf(_stderr,"\t--ouput, -o file\n");
  fprintf(_stderr,"\t\tPath to a file to store the modified image in.\n");
  fprintf(_stderr,"\n");
  fprintf(_stderr,"\t--dropon, -d file[,mask]\n");
  fprintf(_stderr,
          "\t\tPath to the image that should be used as dropon. The path to the mask is optional.\n"
         );
  fprintf(_stderr,"\t\tThe dropon and the mask have to be a JPEG and of the same dimension.\n");
  fprintf(_stderr,"\n");
  fprintf(_stderr,"\t--position, -p [t|b][c][l|r]\n");
  fprintf(_stderr,
          "\t\tThe position of the dropon. t = top, b = bottom, l = left, r = right, c = center. Default: center\n"
         );
  fprintf(_stderr,"\n");
  fprintf(_stderr,"\t--offset, -m [horizontal],[vertical]\n");
  fprintf(_stderr,"\t\tThe offset to the given position in pixels. Default: 0,0\n");
  fprintf(_stderr,"\n");
  fprintf(_stderr,"\t--luminance, -y value\n");
  fprintf(_stderr,
          "\t\tChanges the brightness of the image according to the value. Use a negative value\n");
  fprintf(_stderr,"\t\tto darken the image, and a positive value to brighten the image.\n");
  fprintf(_stderr,"\n");
  fprintf(_stderr,"\t--tintblue, -b value\n");
  fprintf(_stderr,
          "\t\tColor the image. Use a negative value to tint the image yellow, and use a positive\n"
         );
  fprintf(_stderr,"\t\tvalue to tint the image blue.\n");
  fprintf(_stderr,"\n");
  fprintf(_stderr,"\t--tintred, -r value\n");
  fprintf(_stderr,
          "\t\tColor the image. Use a negative value to tint the image green, and use a positive\n")
  ;
  fprintf(_stderr,"\t\tvalue to tint the image red.\n");
  fprintf(_stderr,"\n");
  fprintf(_stderr,"\t--pixelate, -x\n");
  fprintf(_stderr,"\t\tPixelate the image into 8x8 blocks.\n");
  fprintf(_stderr,"\n");
  fprintf(_stderr,"\t--grayscale, -g\n");
  fprintf(_stderr,"\t\tReduce the image to grayscale.\n");
  fprintf(_stderr,"\n");
  fprintf(_stderr,"\t--optimize, -O\n");
  fprintf(_stderr,"\t\tOptimize the Huffman tables on storing the output image.\n");
  fprintf(_stderr,"\n");
  fprintf(_stderr,"\t--progressive, -P\n");
  fprintf(_stderr,"\t\tStore the output image in progressive mode.\n");
  fprintf(_stderr,"\n");
  fprintf(_stderr,"\t--arithmetric, -A\n");
  fprintf(_stderr,"\t\tUse arithmetric coding instead of Huffman coding.\n");
  fprintf(_stderr,"\n");
  fprintf(_stderr,"Examples:\n");
  fprintf(_stderr,"\n");
  fprintf(_stderr,"\tPlace a logo in the top right corner:\n");
  fprintf(_stderr,"\t\tmodjpeg --input in.jpg --position tr --dropon logo.jpg --output out.jpg\n");
  fprintf(_stderr,"\n");
  fprintf(_stderr,"\tPixelate the image and then place a logo in the top right corner:\n");
  fprintf(_stderr,
          "\t\tmodjpeg --input in.jpg --pixelate --position tr --dropon logo.jpg --output out.jpg\n"
         );
  fprintf(_stderr,"\n");
  fprintf(_stderr,
          "\tPlace a logo in the top right corner and then pixelate the image (including the logo):\n"
         );
  fprintf(_stderr,
          "\t\tmodjpeg --input in.jpg --position tr --dropon logo.jpg --pixelate --output out.jpg\n"
         );
  fprintf(_stderr,"\n");
  fprintf(_stderr,"\n");
  return;
}

Assistant:

void help(void) {
    fprintf(stderr, "modjpeg (c) 2006+ Ingo Oppermann\n\n");

    fprintf(stderr, "The order for the options is important, i.e. a dropon can't be applied without\n");
    fprintf(stderr, "loading an image first.\n\n");

    fprintf(stderr, "Options:\n\n");

    fprintf(stderr, "\t--input, -i file\n");
    fprintf(stderr, "\t\tPath to the image to be modified. The image needs to be a JPEG.\n");
    fprintf(stderr, "\n");

    fprintf(stderr, "\t--ouput, -o file\n");
    fprintf(stderr, "\t\tPath to a file to store the modified image in.\n");
    fprintf(stderr, "\n");

    fprintf(stderr, "\t--dropon, -d file[,mask]\n");
    fprintf(stderr, "\t\tPath to the image that should be used as dropon. The path to the mask is optional.\n");
    fprintf(stderr, "\t\tThe dropon and the mask have to be a JPEG and of the same dimension.\n");
    fprintf(stderr, "\n");

    fprintf(stderr, "\t--position, -p [t|b][c][l|r]\n");
    fprintf(stderr, "\t\tThe position of the dropon. t = top, b = bottom, l = left, r = right, c = center. Default: center\n");
    fprintf(stderr, "\n");

    fprintf(stderr, "\t--offset, -m [horizontal],[vertical]\n");
    fprintf(stderr, "\t\tThe offset to the given position in pixels. Default: 0,0\n");
    fprintf(stderr, "\n");

    fprintf(stderr, "\t--luminance, -y value\n");
    fprintf(stderr, "\t\tChanges the brightness of the image according to the value. Use a negative value\n");
    fprintf(stderr, "\t\tto darken the image, and a positive value to brighten the image.\n");
    fprintf(stderr, "\n");

    fprintf(stderr, "\t--tintblue, -b value\n");
    fprintf(stderr, "\t\tColor the image. Use a negative value to tint the image yellow, and use a positive\n");
    fprintf(stderr, "\t\tvalue to tint the image blue.\n");
    fprintf(stderr, "\n");

    fprintf(stderr, "\t--tintred, -r value\n");
    fprintf(stderr, "\t\tColor the image. Use a negative value to tint the image green, and use a positive\n");
    fprintf(stderr, "\t\tvalue to tint the image red.\n");
    fprintf(stderr, "\n");

    fprintf(stderr, "\t--pixelate, -x\n");
    fprintf(stderr, "\t\tPixelate the image into 8x8 blocks.\n");
    fprintf(stderr, "\n");

    fprintf(stderr, "\t--grayscale, -g\n");
    fprintf(stderr, "\t\tReduce the image to grayscale.\n");
    fprintf(stderr, "\n");

    fprintf(stderr, "\t--optimize, -O\n");
    fprintf(stderr, "\t\tOptimize the Huffman tables on storing the output image.\n");
    fprintf(stderr, "\n");

    fprintf(stderr, "\t--progressive, -P\n");
    fprintf(stderr, "\t\tStore the output image in progressive mode.\n");
    fprintf(stderr, "\n");

    fprintf(stderr, "\t--arithmetric, -A\n");
    fprintf(stderr, "\t\tUse arithmetric coding instead of Huffman coding.\n");
    fprintf(stderr, "\n");

    fprintf(stderr, "Examples:\n");
    fprintf(stderr, "\n");

    fprintf(stderr, "\tPlace a logo in the top right corner:\n");
    fprintf(stderr, "\t\tmodjpeg --input in.jpg --position tr --dropon logo.jpg --output out.jpg\n");
    fprintf(stderr, "\n");

    fprintf(stderr, "\tPixelate the image and then place a logo in the top right corner:\n");
    fprintf(stderr, "\t\tmodjpeg --input in.jpg --pixelate --position tr --dropon logo.jpg --output out.jpg\n");
    fprintf(stderr, "\n");

    fprintf(stderr, "\tPlace a logo in the top right corner and then pixelate the image (including the logo):\n");
    fprintf(stderr, "\t\tmodjpeg --input in.jpg --position tr --dropon logo.jpg --pixelate --output out.jpg\n");
    fprintf(stderr, "\n");

    fprintf(stderr, "\n");
    return;
}